

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  unixShmNode *zBuf;
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *psVar2;
  char **pOld;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  sqlite3_io_methods *p;
  uint *puVar9;
  size_t sVar10;
  unixShmNode *puVar11;
  char **nBytes;
  u64 uVar12;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  int iVar15;
  long lVar16;
  undefined4 in_register_00000034;
  char *pcVar17;
  ulong uVar18;
  int x;
  stat sStat;
  int local_d4;
  undefined8 local_d0;
  sqlite3_io_methods *local_c8;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  undefined4 local_a0;
  long local_90;
  
  local_d0 = CONCAT44(in_register_00000034,iRegion);
  uVar5 = (*aSyscall[0x19].pCurrent)();
  uVar8 = 1;
  if (0x7fff < (int)uVar5) {
    uVar8 = (ulong)(uVar5 >> 0xf);
  }
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    iVar7 = sqlite3_initialize();
    if (iVar7 == 0) {
      p = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    }
    else {
      p = (sqlite3_io_methods *)0x0;
    }
    if (p == (sqlite3_io_methods *)0x0) {
      iVar7 = 7;
    }
    else {
      *(undefined8 *)p = 0;
      p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
      p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
      if (unixBigLock != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
      }
      psVar1 = fd[2].pMethods;
      puVar11 = (unixShmNode *)psVar1->xLock;
      iVar7 = 0;
      if (puVar11 == (unixShmNode *)0x0) {
        psVar2 = fd[7].pMethods;
        iVar7 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
        if (iVar7 == 0) {
          sVar10 = strlen((char *)psVar2);
          uVar12 = (long)(int)sVar10 + 0x66;
          iVar7 = sqlite3_initialize();
          local_c8 = psVar2;
          if (iVar7 == 0) {
            puVar11 = (unixShmNode *)sqlite3Malloc(uVar12);
          }
          else {
            puVar11 = (unixShmNode *)0x0;
          }
          iVar7 = 7;
          if (puVar11 == (unixShmNode *)0x0) goto LAB_00127751;
          memset(puVar11,0,uVar12);
          zBuf = puVar11 + 1;
          puVar11->zFilename = (char *)zBuf;
          sqlite3_snprintf((int)sVar10 + 6,(char *)zBuf,"%s-shm",local_c8);
          puVar11->hShm = -1;
          psVar2 = fd[2].pMethods;
          psVar2->xLock = (_func_int_sqlite3_file_ptr_int *)puVar11;
          puVar11->pInode = (unixInodeInfo *)psVar2;
          if (sqlite3Config.bCoreMutex != '\0') {
            iVar6 = sqlite3_initialize();
            if (iVar6 == 0) {
              psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(0);
            }
            else {
              psVar14 = (sqlite3_mutex *)0x0;
            }
            puVar11->pShmMutex = psVar14;
            if (psVar14 != (sqlite3_mutex *)0x0) goto LAB_00127bd4;
            goto LAB_00127754;
          }
LAB_00127bd4:
          bVar4 = true;
          if (*(char *)((long)&psVar1->xTruncate + 1) == '\0') {
            iVar7 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
            if (iVar7 == 0) {
              iVar7 = robust_open((char *)zBuf,0x20042,local_a8 & 0x1ff);
              puVar11->hShm = iVar7;
            }
            if (puVar11->hShm < 0) {
              iVar7 = robust_open((char *)zBuf,0x20000,local_a8 & 0x1ff);
              puVar11->hShm = iVar7;
              if (iVar7 < 0) {
                bVar4 = false;
                iVar7 = 0xe;
                sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x9ccc,
                            "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                unixLogErrorAtLine(0xe,"open",(char *)zBuf,0x9ccc);
                goto LAB_0012775b;
              }
              puVar11->isReadonly = '\x01';
            }
            uVar5 = puVar11->hShm;
            iVar7 = (*aSyscall[0x15].pCurrent)();
            if (iVar7 == 0) {
              (*aSyscall[0x14].pCurrent)((ulong)uVar5,(ulong)local_a4,local_a0);
            }
            iVar7 = unixLockSharedMemory((unixFile *)fd,puVar11);
            if ((iVar7 != 0x508) && (iVar7 != 0)) goto LAB_00127754;
          }
          else {
            iVar7 = 0;
          }
        }
        else {
          iVar7 = 0x70a;
LAB_00127751:
          puVar11 = (unixShmNode *)0x0;
LAB_00127754:
          bVar4 = false;
        }
LAB_0012775b:
        if (bVar4) goto LAB_00127768;
        unixShmPurge((unixFile *)fd);
        sqlite3_free(p);
        psVar14 = unixBigLock;
      }
      else {
LAB_00127768:
        *(unixShmNode **)p = puVar11;
        puVar11->nRef = puVar11->nRef + 1;
        fd[8].pMethods = p;
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
        if (puVar11->pShmMutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(puVar11->pShmMutex);
        }
        p->xClose = (_func_int_sqlite3_file_ptr *)puVar11->pFirst;
        puVar11->pFirst = (unixShm *)p;
        psVar14 = puVar11->pShmMutex;
      }
      if (psVar14 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar14);
      }
    }
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  puVar11 = *(unixShmNode **)fd[8].pMethods;
  if (puVar11->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(puVar11->pShmMutex);
  }
  iVar7 = (int)local_d0;
  if (puVar11->isUnlocked != '\0') {
    iVar6 = unixLockSharedMemory((unixFile *)fd,puVar11);
    if (iVar6 != 0) goto LAB_00127b63;
    puVar11->isUnlocked = '\0';
  }
  iVar3 = (int)uVar8;
  iVar15 = (iVar7 + iVar3) - (iVar7 + iVar3) % iVar3;
  iVar6 = 0;
  if (iVar15 <= (int)(uint)puVar11->nRegion) goto LAB_00127b63;
  puVar11->szRegion = szRegion;
  iVar6 = 0;
  if (puVar11->hShm < 0) {
LAB_001279d4:
    pOld = puVar11->apRegion;
    iVar7 = sqlite3_initialize();
    nBytes = (char **)0x0;
    if (iVar7 == 0) {
      if (0 < iVar15 * 8) {
        nBytes = (char **)(ulong)(uint)(iVar15 * 8);
      }
      nBytes = (char **)sqlite3Realloc(pOld,(u64)nBytes);
    }
    if (nBytes == (char **)0x0) {
      iVar6 = 0xc0a;
    }
    else {
      puVar11->apRegion = nBytes;
      uVar12 = (u64)(iVar3 * szRegion);
      do {
        if (iVar15 <= (int)(uint)puVar11->nRegion) break;
        if (puVar11->hShm < 0) {
          iVar7 = sqlite3_initialize();
          if (iVar7 == 0) {
            pcVar17 = (char *)sqlite3Malloc(uVar12);
          }
          else {
            pcVar17 = (char *)0x0;
          }
          if (pcVar17 != (char *)0x0) {
            memset(pcVar17,0,uVar12);
            goto LAB_00127b03;
          }
          iVar6 = 7;
          bVar4 = false;
        }
        else {
          pcVar17 = (char *)(*aSyscall[0x16].pCurrent)
                                      (0,uVar12,(ulong)((uint)(puVar11->isReadonly == '\0') * 2 + 1)
                                       ,1,(ulong)(uint)puVar11->hShm,
                                       (ulong)puVar11->nRegion * (long)szRegion);
          if (pcVar17 == (char *)0xffffffffffffffff) {
            pcVar17 = puVar11->zFilename;
            puVar9 = (uint *)__errno_location();
            if (pcVar17 == (char *)0x0) {
              pcVar17 = "";
            }
            bVar4 = false;
            iVar6 = 0x150a;
            sqlite3_log(0x150a,"os_unix.c:%d: (%d) %s(%s) - %s",0x9d77,(ulong)*puVar9,"mmap",pcVar17
                        ,"");
          }
          else {
LAB_00127b03:
            if (iVar3 != 0) {
              uVar13 = (ulong)puVar11->nRegion;
              uVar18 = uVar8;
              do {
                puVar11->apRegion[uVar13] = pcVar17;
                uVar13 = uVar13 + 1;
                pcVar17 = pcVar17 + szRegion;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
            }
            puVar11->nRegion = puVar11->nRegion + (short)uVar8;
            bVar4 = true;
          }
        }
      } while (bVar4);
    }
  }
  else {
    iVar7 = (*aSyscall[5].pCurrent)((ulong)(uint)puVar11->hShm,local_c0);
    if (iVar7 == 0) {
      iVar7 = iVar15 * szRegion;
      iVar6 = 0;
      if (iVar7 <= local_90) goto LAB_001279d4;
      if (bExtend == 0) {
        iVar6 = 0;
      }
      else {
        lVar16 = local_90 + 0xfff;
        if (-1 < local_90) {
          lVar16 = local_90;
        }
        iVar6 = iVar7 + 0xfff;
        if (-1 < iVar7) {
          iVar6 = iVar7;
        }
        iVar7 = (int)(lVar16 >> 0xc);
        if (iVar7 < iVar6 >> 0xc) {
          lVar16 = (long)(iVar6 >> 0xc) - (long)iVar7;
          uVar18 = (long)iVar7 << 0xc | 0xfff;
          iVar6 = 0;
          do {
            local_d4 = 0;
            iVar7 = seekAndWriteFd(puVar11->hShm,uVar18,"",1,&local_d4);
            bVar4 = false;
            if (iVar7 != 1) {
              pcVar17 = puVar11->zFilename;
              puVar9 = (uint *)__errno_location();
              if (pcVar17 == (char *)0x0) {
                pcVar17 = "";
              }
              iVar6 = 0x130a;
              sqlite3_log(0x130a,"os_unix.c:%d: (%d) %s(%s) - %s",0x9d5c,(ulong)*puVar9,"write",
                          pcVar17,"");
              bVar4 = true;
            }
            if (iVar7 != 1) goto LAB_001279cc;
            uVar18 = uVar18 + 0x1000;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
          bVar4 = false;
        }
        else {
          bVar4 = false;
          iVar6 = 0;
        }
LAB_001279cc:
        if (!bVar4) goto LAB_001279d4;
      }
    }
    else {
      iVar6 = 0x130a;
    }
  }
  iVar7 = (int)local_d0;
LAB_00127b63:
  if (iVar7 < (int)(uint)puVar11->nRegion) {
    pcVar17 = puVar11->apRegion[iVar7];
  }
  else {
    pcVar17 = (char *)0x0;
  }
  *pp = pcVar17;
  iVar7 = 8;
  if (iVar6 != 0) {
    iVar7 = iVar6;
  }
  if (puVar11->isReadonly == '\0') {
    iVar7 = iVar6;
  }
  if (puVar11->pShmMutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(puVar11->pShmMutex);
  }
  return iVar7;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  if( pShmNode->isUnlocked ){
    rc = unixLockSharedMemory(pDbFd, pShmNode);
    if( rc!=SQLITE_OK ) goto shmpage_out;
    pShmNode->isUnlocked = 0;
  }
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->hShm>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->hShm<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->hShm>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->hShm, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }

      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->hShm, iPg*pgsz + pgsz-1,"",1,&x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->hShm>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE,
            MAP_SHARED, pShmNode->hShm, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(nMap);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, nMap);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->pShmMutex);
  return rc;
}